

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

void core::image::save_ppm_file(ConstPtr *image,string *filename)

{
  __shared_ptr<core::ImageBase_const,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<core::ImageBase_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<core::Image<unsigned_char>const,void>
            (local_28,&image->
                       super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
            );
  save_ppm_file_intern((ConstPtr *)local_28,filename);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return;
}

Assistant:

void
save_ppm_file (ByteImage::ConstPtr image, std::string const& filename)
{
    save_ppm_file_intern(image, filename);
}